

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_pack(REF_INTERP ref_interp,REF_INT *n2o)

{
  undefined8 *puVar1;
  REF_DBL *pRVar2;
  undefined8 *puVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  uint max;
  int iVar6;
  REF_INT *pRVar7;
  REF_DBL *pRVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  REF_DBL RVar11;
  REF_DBL RVar12;
  REF_DBL RVar13;
  uint uVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  
  uVar14 = 0;
  if (ref_interp != (REF_INTERP)0x0) {
    uVar5 = ref_interp->to_grid->node->n;
    lVar19 = (long)(int)uVar5;
    max = ref_interp->max;
    uVar17 = (ulong)max;
    if (((int)max < (int)uVar5) && (uVar14 = ref_interp_resize(ref_interp,max), uVar14 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x13a,"ref_interp_pack",(ulong)uVar14,"match node max");
      return uVar14;
    }
    iVar6 = ref_interp->ref_agents->n;
    if ((long)iVar6 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x13c,"ref_interp_pack","can\'t pack active agents",0,(long)iVar6);
      uVar14 = 1;
    }
    if (iVar6 == 0) {
      if (0 < (int)max) {
        uVar22 = 0;
        do {
          iVar6 = ref_interp->agent_hired[uVar22];
          if ((long)iVar6 != 0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x13f,"ref_interp_pack","can\'t pack hired agents",0,(long)iVar6);
            uVar14 = 1;
          }
          if (iVar6 != 0) {
            return uVar14;
          }
          uVar22 = uVar22 + 1;
        } while (uVar17 != uVar22);
      }
      if ((int)max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x142,"ref_interp_pack","malloc int_copy of REF_INT negative");
        uVar14 = 1;
      }
      else {
        pvVar15 = malloc(uVar17 * 4);
        if (pvVar15 == (void *)0x0) {
          pcVar21 = "malloc int_copy of REF_INT NULL";
          uVar18 = 0x142;
        }
        else {
          if (uVar17 != 0) {
            memcpy(pvVar15,ref_interp->cell,uVar17 * 4);
          }
          if (0 < (int)uVar5) {
            pRVar7 = ref_interp->cell;
            lVar16 = 0;
            do {
              pRVar7[lVar16] = *(REF_INT *)((long)pvVar15 + (long)n2o[lVar16] * 4);
              lVar16 = lVar16 + 1;
            } while (lVar19 != lVar16);
          }
          if ((int)uVar5 < (int)max) {
            memset(ref_interp->cell + lVar19,0xff,(ulong)(~uVar5 + max) * 4 + 4);
          }
          if (uVar17 != 0) {
            uVar22 = 1;
            if (1 < (int)max) {
              uVar22 = (ulong)max;
            }
            memcpy(pvVar15,ref_interp->part,uVar22 << 2);
          }
          if (0 < (int)uVar5) {
            pRVar7 = ref_interp->part;
            lVar16 = 0;
            do {
              pRVar7[lVar16] = *(REF_INT *)((long)pvVar15 + (long)n2o[lVar16] * 4);
              lVar16 = lVar16 + 1;
            } while (lVar19 != lVar16);
          }
          if ((int)uVar5 < (int)max) {
            memset(ref_interp->part + lVar19,0xff,(ulong)(~uVar5 + max) * 4 + 4);
          }
          free(pvVar15);
          pvVar15 = malloc((ulong)(max * 4) << 3);
          if (pvVar15 != (void *)0x0) {
            if (uVar17 != 0) {
              pRVar8 = ref_interp->bary;
              uVar17 = 1;
              if (1 < (int)max) {
                uVar17 = (ulong)max;
              }
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)pRVar8 + lVar16);
                uVar18 = *puVar1;
                uVar9 = puVar1[1];
                puVar1 = (undefined8 *)((long)pRVar8 + lVar16 + 0x10);
                uVar10 = puVar1[1];
                puVar3 = (undefined8 *)((long)pvVar15 + lVar16 + 0x10);
                *puVar3 = *puVar1;
                puVar3[1] = uVar10;
                *(undefined8 *)((long)pvVar15 + lVar16) = uVar18;
                ((undefined8 *)((long)pvVar15 + lVar16))[1] = uVar9;
                lVar16 = lVar16 + 0x20;
              } while (uVar17 * 0x20 != lVar16);
            }
            if (0 < (int)uVar5) {
              pRVar8 = ref_interp->bary;
              lVar16 = 0;
              do {
                lVar20 = (long)*(int *)((long)n2o + lVar16) * 0x20;
                pRVar2 = (REF_DBL *)((long)pvVar15 + lVar20);
                RVar11 = *pRVar2;
                RVar12 = pRVar2[1];
                pRVar2 = (REF_DBL *)((long)pvVar15 + lVar20 + 0x10);
                RVar13 = pRVar2[1];
                pRVar4 = pRVar8 + lVar16 + 2;
                *pRVar4 = *pRVar2;
                pRVar4[1] = RVar13;
                pRVar2 = pRVar8 + lVar16;
                *pRVar2 = RVar11;
                pRVar2[1] = RVar12;
                lVar16 = lVar16 + 4;
              } while (lVar19 * 4 != lVar16);
            }
            free(pvVar15);
            return 0;
          }
          pcVar21 = "malloc dbl_copy of REF_DBL NULL";
          uVar18 = 0x157;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar18,"ref_interp_pack",pcVar21);
        uVar14 = 2;
      }
    }
  }
  return uVar14;
}

Assistant:

REF_FCN REF_STATUS ref_interp_pack(REF_INTERP ref_interp, REF_INT *n2o) {
  REF_INT *int_copy;
  REF_DBL *dbl_copy;
  REF_INT i, node, n, max;

  if (NULL == ref_interp) return REF_SUCCESS;

  n = ref_node_n(ref_grid_node(ref_interp_to_grid(ref_interp)));
  max = ref_interp_max(ref_interp);
  if (n > max) {
    RSS(ref_interp_resize(ref_interp, max), "match node max");
  }
  REIS(0, ref_agents_n(ref_interp->ref_agents), "can't pack active agents");

  for (node = 0; node < max; node++) {
    REIS(REF_FALSE, ref_interp->agent_hired[node], "can't pack hired agents");
  }

  ref_malloc(int_copy, max, REF_INT);
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->cell[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->cell[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->cell[node] = REF_EMPTY;
  }
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->part[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->part[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->part[node] = REF_EMPTY;
  }
  ref_free(int_copy);

  ref_malloc(dbl_copy, 4 * max, REF_DBL);
  for (node = 0; node < max; node++) {
    for (i = 0; i < 4; i++) {
      dbl_copy[i + 4 * node] = ref_interp->bary[i + 4 * node];
    }
  }
  for (node = 0; node < n; node++) {
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = dbl_copy[i + 4 * n2o[node]];
    }
  }
  ref_free(dbl_copy);

  return REF_SUCCESS;
}